

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_overflowCorrectIfNeeded
               (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,void *ip,void *iend)

{
  ZSTD_window_t window;
  U32 UVar1;
  U32 maxDist_00;
  U32 UVar2;
  void *in_RCX;
  long in_RDX;
  undefined1 (*in_RDI) [12];
  void *in_R8;
  U32 correction;
  U32 maxDist;
  U32 cycleLog;
  U32 reducerValue;
  ZSTD_CCtx_params *params_00;
  ZSTD_matchState_t *ms_00;
  void *in_stack_ffffffffffffffc0;
  U32 in_stack_ffffffffffffffc8;
  U32 in_stack_ffffffffffffffcc;
  
  UVar1 = ZSTD_cycleLog(*(U32 *)(in_RDX + 8),*(ZSTD_strategy *)(in_RDX + 0x1c));
  maxDist_00 = 1 << ((byte)*(undefined4 *)(in_RDX + 4) & 0x1f);
  params_00 = *(ZSTD_CCtx_params **)(in_RDI[1] + 4);
  ms_00 = *(ZSTD_matchState_t **)in_RDI[2];
  reducerValue = (U32)((ulong)*(undefined8 *)(*in_RDI + 8) >> 0x20);
  window.base._4_4_ = reducerValue;
  window._0_12_ = *in_RDI;
  window.dictBase = (BYTE *)params_00;
  window._24_8_ = ms_00;
  window._32_8_ = *(undefined8 *)(in_RDI[2] + 8);
  UVar2 = ZSTD_window_needOverflowCorrection
                    (window,UVar1,maxDist_00,*(U32 *)(in_RDI[3] + 4),in_RCX,in_R8);
  if (UVar2 != 0) {
    UVar1 = ZSTD_window_correctOverflow
                      ((ZSTD_window_t *)CONCAT44(UVar1,maxDist_00),in_stack_ffffffffffffffcc,
                       in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    ZSTD_cwksp_mark_tables_dirty((ZSTD_cwksp *)0x2be3a6);
    ZSTD_reduceIndex(ms_00,params_00,reducerValue);
    ZSTD_cwksp_mark_tables_clean((ZSTD_cwksp *)0x2be3c3);
    if (*(uint *)(in_RDI[3] + 8) < UVar1) {
      *(undefined4 *)(in_RDI[3] + 8) = 0;
    }
    else {
      *(U32 *)(in_RDI[3] + 8) = *(int *)(in_RDI[3] + 8) - UVar1;
    }
    *(undefined4 *)(in_RDI[3] + 4) = 0;
    *(undefined8 *)(in_RDI[0x14] + 8) = 0;
  }
  return;
}

Assistant:

static void ZSTD_overflowCorrectIfNeeded(ZSTD_matchState_t* ms,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         void const* ip,
                                         void const* iend)
{
    U32 const cycleLog = ZSTD_cycleLog(params->cParams.chainLog, params->cParams.strategy);
    U32 const maxDist = (U32)1 << params->cParams.windowLog;
    if (ZSTD_window_needOverflowCorrection(ms->window, cycleLog, maxDist, ms->loadedDictEnd, ip, iend)) {
        U32 const correction = ZSTD_window_correctOverflow(&ms->window, cycleLog, maxDist, ip);
        ZSTD_STATIC_ASSERT(ZSTD_CHAINLOG_MAX <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX_32 <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX <= 31);
        ZSTD_cwksp_mark_tables_dirty(ws);
        ZSTD_reduceIndex(ms, params, correction);
        ZSTD_cwksp_mark_tables_clean(ws);
        if (ms->nextToUpdate < correction) ms->nextToUpdate = 0;
        else ms->nextToUpdate -= correction;
        /* invalidate dictionaries on overflow correction */
        ms->loadedDictEnd = 0;
        ms->dictMatchState = NULL;
    }
}